

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setPivot(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int p_stage,int p_col,int p_row,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *val)

{
  uint *puVar1;
  pointer pnVar2;
  type_conflict5 tVar3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_00;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *arg_01;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_158;
  cpp_dec_float<50U,_int,_void> local_120;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  int local_80;
  undefined1 local_7c;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  (this->row).orig[p_stage] = p_row;
  (this->col).orig[p_stage] = p_col;
  (this->row).perm[p_row] = p_stage;
  (this->col).perm[p_col] = p_stage;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&local_120,1.0,(type *)0x0);
  local_158.fpclass = cpp_dec_float_finite;
  local_158.prec_elem = 10;
  local_158.data._M_elems[0] = 0;
  local_158.data._M_elems[1] = 0;
  local_158.data._M_elems[2] = 0;
  local_158.data._M_elems[3] = 0;
  local_158.data._M_elems[4] = 0;
  local_158.data._M_elems[5] = 0;
  local_158.data._M_elems._24_5_ = 0;
  local_158.data._M_elems[7]._1_3_ = 0;
  local_158.data._M_elems._32_5_ = 0;
  local_158.data._M_elems[9]._1_3_ = 0;
  local_158.exp = 0;
  local_158.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            (&local_158,&local_120,&val->m_backend);
  pnVar2 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  *(ulong *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20) =
       CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
  *(undefined8 *)puVar1 = local_158.data._M_elems._16_8_;
  *(ulong *)(puVar1 + 2) = CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_)
  ;
  *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems = local_158.data._M_elems._0_8_;
  *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8) = local_158.data._M_elems._8_8_;
  pnVar2[p_row].m_backend.exp = local_158.exp;
  pnVar2[p_row].m_backend.neg = local_158.neg;
  pnVar2[p_row].m_backend.fpclass = local_158.fpclass;
  pnVar2[p_row].m_backend.prec_elem = local_158.prec_elem;
  local_68 = *(undefined8 *)(val->m_backend).data._M_elems;
  uStack_60 = *(undefined8 *)((val->m_backend).data._M_elems + 2);
  local_58 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
  uStack_50 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
  local_48 = *(undefined8 *)((val->m_backend).data._M_elems + 8);
  local_40 = (val->m_backend).exp;
  local_3c = (val->m_backend).neg;
  local_38._0_4_ = (val->m_backend).fpclass;
  local_38._4_4_ = (val->m_backend).prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((type *)&local_158,(multiprecision *)&local_68,arg);
  local_120.data._M_elems._0_8_ =
       Tolerances::epsilonPivot
                 ((this->_tolerances).
                  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_158,(double *)&local_120);
  if (tVar3) {
    this->stat = SINGULAR;
  }
  pnVar2 = (this->diag).
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_88 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20);
  local_a8 = *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems;
  uStack_a0 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8);
  puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
  local_98 = *(undefined8 *)puVar1;
  uStack_90 = *(undefined8 *)(puVar1 + 2);
  local_80 = pnVar2[p_row].m_backend.exp;
  local_7c = pnVar2[p_row].m_backend.neg;
  local_78._0_4_ = pnVar2[p_row].m_backend.fpclass;
  local_78._4_4_ = pnVar2[p_row].m_backend.prec_elem;
  boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
            ((type *)&local_158,(multiprecision *)&local_a8,arg_00);
  tVar3 = boost::multiprecision::operator>
                    ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_158,&this->maxabs);
  if (tVar3) {
    pnVar2 = (this->diag).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_c8 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x20);
    local_e8 = *(undefined8 *)pnVar2[p_row].m_backend.data._M_elems;
    uStack_e0 = *(undefined8 *)((long)pnVar2[p_row].m_backend.data._M_elems + 8);
    puVar1 = (uint *)((long)pnVar2[p_row].m_backend.data._M_elems + 0x10);
    local_d8 = *(undefined8 *)puVar1;
    uStack_d0 = *(undefined8 *)(puVar1 + 2);
    local_c0 = pnVar2[p_row].m_backend.exp;
    local_bc = pnVar2[p_row].m_backend.neg;
    local_b8._0_4_ = pnVar2[p_row].m_backend.fpclass;
    local_b8._4_4_ = pnVar2[p_row].m_backend.prec_elem;
    boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((type *)&local_158,(multiprecision *)&local_e8,arg_01);
    *(ulong *)((this->maxabs).m_backend.data._M_elems + 8) =
         CONCAT35(local_158.data._M_elems[9]._1_3_,local_158.data._M_elems._32_5_);
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 4) = local_158.data._M_elems._16_8_;
    *(ulong *)((this->maxabs).m_backend.data._M_elems + 6) =
         CONCAT35(local_158.data._M_elems[7]._1_3_,local_158.data._M_elems._24_5_);
    *(undefined8 *)(this->maxabs).m_backend.data._M_elems = local_158.data._M_elems._0_8_;
    *(undefined8 *)((this->maxabs).m_backend.data._M_elems + 2) = local_158.data._M_elems._8_8_;
    (this->maxabs).m_backend.exp = local_158.exp;
    (this->maxabs).m_backend.neg = local_158.neg;
    (this->maxabs).m_backend.fpclass = local_158.fpclass;
    (this->maxabs).m_backend.prec_elem = local_158.prec_elem;
  }
  return;
}

Assistant:

void CLUFactor<R>::setPivot(const int p_stage,
                            const int p_col,
                            const int p_row,
                            const R val)
{
   assert(row.perm[p_row] < 0);
   assert(col.perm[p_col] < 0);

   row.orig[p_stage] = p_row;
   col.orig[p_stage] = p_col;
   row.perm[p_row]   = p_stage;
   col.perm[p_col]   = p_stage;
   diag[p_row]       = R(1.0) / val;

   if(spxAbs(val) < _tolerances->epsilonPivot())
   {
#ifndef NDEBUG
      SPX_MSG_ERROR(std::cerr
                    << "LU pivot element is almost zero (< "
                    << _tolerances->epsilonPivot()
                    << ") - Basis is numerically singular"
                    << std::endl;)
#endif
      this->stat = SLinSolver<R>::SINGULAR;
   }

   if(spxAbs(diag[p_row]) > maxabs)
      maxabs = spxAbs(diag[p_row]);
}